

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O3

void net_addr_str(NETADDR *addr,char *string,int max_length,int add_port)

{
  uint uVar1;
  char *pcVar2;
  
  uVar1 = addr->type;
  if (uVar1 == 2) {
    if (add_port == 0) {
      pcVar2 = "[%x:%x:%x:%x:%x:%x:%x:%x]";
    }
    else {
      pcVar2 = "[%x:%x:%x:%x:%x:%x:%x:%x]:%d";
    }
    str_format(string,max_length,pcVar2,
               (ulong)(ushort)(*(ushort *)addr->ip << 8 | *(ushort *)addr->ip >> 8),
               (ulong)(ushort)(*(ushort *)(addr->ip + 2) << 8 | *(ushort *)(addr->ip + 2) >> 8),
               (ulong)(ushort)(*(ushort *)(addr->ip + 4) << 8 | *(ushort *)(addr->ip + 4) >> 8),
               (ulong)(ushort)(*(ushort *)(addr->ip + 6) << 8 | *(ushort *)(addr->ip + 6) >> 8),
               (ulong)(ushort)(*(ushort *)(addr->ip + 8) << 8 | *(ushort *)(addr->ip + 8) >> 8),
               (ulong)(ushort)(*(ushort *)(addr->ip + 10) << 8 | *(ushort *)(addr->ip + 10) >> 8),
               (ulong)(ushort)(*(ushort *)(addr->ip + 0xc) << 8 | *(ushort *)(addr->ip + 0xc) >> 8),
               (ulong)(ushort)(*(ushort *)(addr->ip + 0xe) << 8 | *(ushort *)(addr->ip + 0xe) >> 8))
    ;
  }
  else {
    if (uVar1 != 1) {
      str_format(string,max_length,"unknown type %d",(ulong)uVar1);
      return;
    }
    if (add_port == 0) {
      pcVar2 = "%d.%d.%d.%d";
    }
    else {
      pcVar2 = "%d.%d.%d.%d:%d";
    }
    str_format(string,max_length,pcVar2,(ulong)addr->ip[0],(ulong)addr->ip[1],(ulong)addr->ip[2],
               (ulong)addr->ip[3]);
  }
  return;
}

Assistant:

void net_addr_str(const NETADDR *addr, char *string, int max_length, int add_port)
{
	if(addr->type == NETTYPE_IPV4)
	{
		if(add_port != 0)
			str_format(string, max_length, "%d.%d.%d.%d:%d", addr->ip[0], addr->ip[1], addr->ip[2], addr->ip[3], addr->port);
		else
			str_format(string, max_length, "%d.%d.%d.%d", addr->ip[0], addr->ip[1], addr->ip[2], addr->ip[3]);
	}
	else if(addr->type == NETTYPE_IPV6)
	{
		if(add_port != 0)
			str_format(string, max_length, "[%x:%x:%x:%x:%x:%x:%x:%x]:%d",
				(addr->ip[0]<<8)|addr->ip[1], (addr->ip[2]<<8)|addr->ip[3], (addr->ip[4]<<8)|addr->ip[5], (addr->ip[6]<<8)|addr->ip[7],
				(addr->ip[8]<<8)|addr->ip[9], (addr->ip[10]<<8)|addr->ip[11], (addr->ip[12]<<8)|addr->ip[13], (addr->ip[14]<<8)|addr->ip[15],
				addr->port);
		else
			str_format(string, max_length, "[%x:%x:%x:%x:%x:%x:%x:%x]",
				(addr->ip[0]<<8)|addr->ip[1], (addr->ip[2]<<8)|addr->ip[3], (addr->ip[4]<<8)|addr->ip[5], (addr->ip[6]<<8)|addr->ip[7],
				(addr->ip[8]<<8)|addr->ip[9], (addr->ip[10]<<8)|addr->ip[11], (addr->ip[12]<<8)|addr->ip[13], (addr->ip[14]<<8)|addr->ip[15]);
	}
	else
		str_format(string, max_length, "unknown type %d", addr->type);
}